

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_seti(lua_State *L,int idx,lua_Integer n)

{
  Table *t;
  TValue *t_00;
  TValue *io;
  uint hres;
  TValue temp;
  Value local_28;
  undefined1 local_20;
  
  t_00 = index2value(L,idx);
  hres = 2;
  if (t_00->tt_ == 'E') {
    t = (Table *)(t_00->value_).f;
    if (n - 1U < (ulong)t->asize) {
      if (((t->metatable != (Table *)0x0) && ((t->metatable->flags & 2) == 0)) &&
         ((*(byte *)((long)t->array + n + 3) & 0xf) == 0)) {
        hres = ~(uint)(n - 1U);
        goto LAB_0010768b;
      }
      *(undefined1 *)((long)t->array + n + 3) = *(undefined1 *)((L->top).offset + -8);
      t->array[-n] = *(Value *)((L->top).offset + -0x10);
    }
    else {
      hres = luaH_psetint(t,n,(TValue *)((L->top).offset + -0x10));
      if (hres != 0) goto LAB_0010768b;
    }
    if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) &&
        ((((t_00->value_).gc)->marked & 0x20) != 0)) &&
       ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
      luaC_barrierback_(L,(t_00->value_).gc);
    }
  }
  else {
LAB_0010768b:
    local_20 = 3;
    local_28.i = n;
    luaV_finishset(L,t_00,(TValue *)&local_28,(TValue *)((L->top).offset + -0x10),hres);
  }
  (L->top).p = (StkId)((L->top).offset + -0x10);
  return;
}

Assistant:

LUA_API void lua_seti (lua_State *L, int idx, lua_Integer n) {
  TValue *t;
  int hres;
  lua_lock(L);
  api_checkpop(L, 1);
  t = index2value(L, idx);
  luaV_fastseti(t, n, s2v(L->top.p - 1), hres);
  if (hres == HOK)
    luaV_finishfastset(L, t, s2v(L->top.p - 1));
  else {
    TValue temp;
    setivalue(&temp, n);
    luaV_finishset(L, t, &temp, s2v(L->top.p - 1), hres);
  }
  L->top.p--;  /* pop value */
  lua_unlock(L);
}